

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

ArgumentsExpression * __thiscall minja::Parser::parseCallArgs(Parser *this)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  element_type *peVar4;
  runtime_error *prVar5;
  ArgumentsExpression *in_RDI;
  shared_ptr<minja::Expression> value;
  VariableExpr *ident;
  shared_ptr<minja::Expression> expr;
  ArgumentsExpression *result;
  VariableExpr *in_stack_fffffffffffffd88;
  ArgumentsExpression *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  SpaceHandling in_stack_fffffffffffffd9c;
  Parser *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  byte in_stack_fffffffffffffdcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  long local_228;
  allocator<char> *paVar6;
  string *in_stack_fffffffffffffe30;
  Parser *in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe57;
  Parser *in_stack_fffffffffffffe58;
  allocator<char> local_181;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  __shared_ptr local_120 [23];
  undefined1 local_109 [33];
  string local_e8 [32];
  long local_c8;
  __shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> local_c0;
  int local_b0;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [35];
  byte local_65;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [48];
  
  consumeSpaces(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
  paVar6 = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,
             (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  consumeToken(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (SpaceHandling)((ulong)paVar6 >> 0x20));
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar1 & 1) != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Expected opening parenthesis in call args");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_65 = 0;
  ArgumentsExpression::ArgumentsExpression(in_stack_fffffffffffffd90);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd88);
    if (!bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    consumeToken(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 (SpaceHandling)((ulong)paVar6 >> 0x20));
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_65 = 1;
      local_b0 = 1;
      break;
    }
    parseExpression(in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_c0);
    if (!bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected expression in call args");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar4 = std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get(&local_c0);
    if (peVar4 == (element_type *)0x0) {
      local_228 = 0;
    }
    else {
      local_228 = __dynamic_cast(peVar4,&Expression::typeinfo,&VariableExpr::typeinfo,0);
    }
    local_c8 = local_228;
    if (local_228 == 0) {
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                ((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                  *)in_stack_fffffffffffffda0,
                 (shared_ptr<minja::Expression> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    else {
      in_stack_fffffffffffffdd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,
                 (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 in_stack_fffffffffffffdc0);
      consumeToken(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   (SpaceHandling)((ulong)paVar6 >> 0x20));
      in_stack_fffffffffffffdcf = std::__cxx11::string::empty();
      in_stack_fffffffffffffdcf = in_stack_fffffffffffffdcf ^ 0xff;
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string((string *)(local_109 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_109);
      if ((in_stack_fffffffffffffdcf & 1) == 0) {
        std::
        vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
        ::emplace_back<std::shared_ptr<minja::Expression>>
                  ((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                    *)in_stack_fffffffffffffda0,
                   (shared_ptr<minja::Expression> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      else {
        parseExpression(in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_120);
        if (!bVar2) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected expression in for named arg");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffd88);
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
        ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                    *)in_stack_fffffffffffffda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (shared_ptr<minja::Expression> *)in_stack_fffffffffffffd90);
        std::__cxx11::string::~string(local_140);
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f6e1b);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    consumeToken(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 (SpaceHandling)((ulong)paVar6 >> 0x20));
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
    if ((bVar1 & 1) == 0) {
      local_b0 = 0;
    }
    else {
      in_stack_fffffffffffffda0 = (Parser *)&stack0xfffffffffffffe37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,
                 (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 in_stack_fffffffffffffdc0);
      consumeToken(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   (SpaceHandling)((ulong)paVar6 >> 0x20));
      uVar3 = std::__cxx11::string::empty();
      in_stack_fffffffffffffd9c = CONCAT13(uVar3,(int3)in_stack_fffffffffffffd9c);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
      if ((in_stack_fffffffffffffd9c & 0x1000000) != Keep) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_65 = 1;
      local_b0 = 1;
    }
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f70cc);
  } while (local_b0 == 0);
  if ((local_65 & 1) == 0) {
    ArgumentsExpression::~ArgumentsExpression(in_stack_fffffffffffffd90);
  }
  return in_RDI;
}

Assistant:

ArgumentsExpression parseCallArgs() {
        consumeSpaces();
        if (consumeToken("(").empty()) throw std::runtime_error("Expected opening parenthesis in call args");

        ArgumentsExpression result;

        while (it != end) {
            if (!consumeToken(")").empty()) {
                return result;
            }
            auto expr = parseExpression();
            if (!expr) throw std::runtime_error("Expected expression in call args");

            if (auto ident = dynamic_cast<VariableExpr*>(expr.get())) {
                if (!consumeToken("=").empty()) {
                    auto value = parseExpression();
                    if (!value) throw std::runtime_error("Expected expression in for named arg");
                    result.kwargs.emplace_back(ident->get_name(), std::move(value));
                } else {
                    result.args.emplace_back(std::move(expr));
                }
            } else {
                result.args.emplace_back(std::move(expr));
            }
            if (consumeToken(",").empty()) {
              if (consumeToken(")").empty()) {
                throw std::runtime_error("Expected closing parenthesis in call args");
              }
              return result;
            }
        }
        throw std::runtime_error("Expected closing parenthesis in call args");
    }